

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::RandSeqProductionSymbol::RandSeqProductionSymbol
          (RandSeqProductionSymbol *this,Compilation *compilation,string_view name,
          SourceLocation loc)

{
  (this->super_Symbol).kind = RandSeqProduction;
  (this->super_Symbol).name._M_len = name._M_len;
  (this->super_Symbol).name._M_str = name._M_str;
  (this->super_Symbol).location = loc;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  Scope::Scope(&this->super_Scope,compilation,&this->super_Symbol);
  DeclaredType::DeclaredType
            (&this->declaredReturnType,&this->super_Symbol,
             (bitmask<slang::ast::DeclaredTypeFlags>)0x0);
  (this->arguments)._M_ptr = (pointer)0x0;
  (this->arguments)._M_extent._M_extent_value = 0;
  (this->rules).
  super__Optional_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
  ._M_engaged = false;
  return;
}

Assistant:

RandSeqProductionSymbol::RandSeqProductionSymbol(Compilation& compilation, std::string_view name,
                                                 SourceLocation loc) :
    Symbol(SymbolKind::RandSeqProduction, name, loc), Scope(compilation, this),
    declaredReturnType(*this) {
}